

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTest<phmap::priv::ConstructorTest,_testing::internal::TemplateSel<phmap::priv::gtest_suite_ConstructorTest_::CopyConstructorAlloc>,_testing::internal::Types<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  type_info *ptVar4;
  _Alloc_hider type_param;
  bool bVar5;
  int iVar6;
  long *plVar7;
  char *pcVar8;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  long *plVar9;
  size_type *psVar10;
  type_info *ptVar11;
  type_info *ptVar12;
  ulong uVar13;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  type_info *local_1a0;
  long local_198;
  type_info local_190;
  undefined7 uStack_18f;
  undefined8 uStack_188;
  int local_17c;
  char *local_178;
  type_info *local_170;
  long local_168;
  long local_160;
  undefined8 uStack_158;
  string local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  char *local_d0;
  char *local_c8;
  CodeLocation local_c0;
  CodeLocation local_98;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,prefix,&local_1a2);
  local_178 = prefix;
  plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
  local_130 = &local_120;
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_120 = *plVar9;
    lStack_118 = plVar7[3];
  }
  else {
    local_120 = *plVar9;
    local_130 = (long *)*plVar7;
  }
  local_128 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_110 = &local_100;
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_100 = *plVar9;
    lStack_f8 = plVar7[3];
  }
  else {
    local_100 = *plVar9;
    local_110 = (long *)*plVar7;
  }
  local_108 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_f0 = &local_e0;
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_e0 = *plVar9;
    lStack_d8 = plVar7[3];
  }
  else {
    local_e0 = *plVar9;
    local_f0 = (long *)*plVar7;
  }
  local_e8 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f0,
                              (ulong)(type_names->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[index]._M_dataplus.
                                     _M_p);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_150.field_2._M_allocated_capacity = *psVar10;
    local_150.field_2._8_8_ = plVar7[3];
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar10;
    local_150._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_150._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_c8 = case_name;
  pcVar8 = strchr(test_names,0x2c);
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,test_names,&local_1a1);
  }
  else {
    local_1a0 = &local_190;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,test_names,pcVar8);
  }
  local_170 = local_1a0;
  local_17c = index;
  local_d0 = test_names;
  if (local_198 != 0) {
    ptVar11 = local_1a0 + local_198;
    do {
      ptVar4 = local_1a0;
      iVar6 = isspace((uint)(byte)ptVar11[-1]);
      local_170 = ptVar4;
      if (iVar6 == 0) break;
      ptVar12 = ptVar11 + -1;
      uVar13 = (long)ptVar12 - (long)ptVar4;
      std::__cxx11::string::_M_erase((ulong)&local_1a0,uVar13);
      ptVar11 = local_1a0 + uVar13;
      local_170 = local_1a0;
    } while (ptVar12 != ptVar4);
  }
  local_1a0 = &local_190;
  if (local_170 == local_1a0) {
    uStack_158 = uStack_188;
    local_170 = (type_info *)&local_160;
  }
  ptVar11 = local_170;
  local_160 = CONCAT71(uStack_18f,local_190);
  local_168 = local_198;
  local_198 = 0;
  local_190 = (type_info)0x0;
  GetTypeName_abi_cxx11_
            (&local_70,
             (internal *)
             &phmap::
              parallel_flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>,4ul,phmap::NullMutex>
              ::typeinfo,local_1a0);
  type_param._M_p = local_70._M_dataplus._M_p;
  local_c0.file._M_dataplus._M_p = (pointer)&local_c0.file.field_2;
  pcVar3 = (code_location->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar3,pcVar3 + (code_location->file)._M_string_length);
  local_c0.line = code_location->line;
  set_up_tc = SuiteApiResolver<phmap::priv::gtest_suite_ConstructorTest_::CopyConstructorAlloc<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>_>
              ::GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,local_c0.line);
  tear_down_tc = SuiteApiResolver<phmap::priv::gtest_suite_ConstructorTest_::CopyConstructorAlloc<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>_>
                 ::GetTearDownCaseOrSuite
                           ((code_location->file)._M_dataplus._M_p,code_location->line);
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00278598;
  MakeAndRegisterTestInfo
            (&local_150,(char *)ptVar11,type_param._M_p,(char *)0x0,&local_c0,
             &TypeIdHelper<phmap::priv::ConstructorTest<phmap::parallel_flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>,4ul,phmap::NullMutex>>>
              ::dummy_,set_up_tc,tear_down_tc,factory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.file._M_dataplus._M_p != &local_c0.file.field_2) {
    operator_delete(local_c0.file._M_dataplus._M_p,local_c0.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_170 != (type_info *)&local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,CONCAT71(uStack_18f,local_190) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  iVar6 = local_17c;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  paVar2 = &local_98.file.field_2;
  local_98.file._M_dataplus._M_p = (code_location->file)._M_dataplus._M_p;
  paVar1 = &(code_location->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.file._M_dataplus._M_p == paVar1) {
    local_98.file.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.file.field_2._8_8_ = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
    local_98.file._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.file.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.file._M_string_length = (code_location->file)._M_string_length;
  (code_location->file)._M_dataplus._M_p = (pointer)paVar1;
  (code_location->file)._M_string_length = 0;
  (code_location->file).field_2._M_local_buf[0] = '\0';
  local_98.line = code_location->line;
  bVar5 = TypeParameterizedTest<phmap::priv::ConstructorTest,_testing::internal::TemplateSel<phmap::priv::gtest_suite_ConstructorTest_::CopyConstructorAlloc>,_testing::internal::Types<phmap::parallel_flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>,_phmap::parallel_flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>_>_>
          ::Register(local_178,&local_98,local_c8,local_d0,iVar6 + 1,type_names);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.file._M_dataplus._M_p,local_98.file.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)]),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>::
        Register(prefix, std::move(code_location), case_name, test_names,
                 index + 1, type_names);
  }